

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cpp
# Opt level: O1

unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>
 __thiscall anon_unknown.dwarf_57b9211::ConstPubkeyProvider::Clone(ConstPubkeyProvider *this)

{
  undefined1 uVar1;
  long lVar2;
  _func_int **pp_Var3;
  long lVar4;
  long in_RSI;
  undefined4 *puVar5;
  undefined4 *puVar6;
  long in_FS_OFFSET;
  byte bVar7;
  
  bVar7 = 0;
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  pp_Var3 = (_func_int **)operator_new(0x50);
  uVar1 = *(undefined1 *)(in_RSI + 0x4d);
  *(undefined4 *)(pp_Var3 + 1) = *(undefined4 *)(in_RSI + 8);
  *pp_Var3 = (_func_int *)&PTR__PubkeyProvider_013e3ce8;
  puVar5 = (undefined4 *)(in_RSI + 0xc);
  puVar6 = (undefined4 *)((long)pp_Var3 + 0xc);
  for (lVar4 = 0x10; lVar4 != 0; lVar4 = lVar4 + -1) {
    *puVar6 = *puVar5;
    puVar5 = puVar5 + (ulong)bVar7 * -2 + 1;
    puVar6 = puVar6 + (ulong)bVar7 * -2 + 1;
  }
  *(undefined1 *)((long)pp_Var3 + 0x4c) = *(undefined1 *)(in_RSI + 0x4c);
  *(undefined1 *)((long)pp_Var3 + 0x4d) = uVar1;
  (this->super_PubkeyProvider)._vptr_PubkeyProvider = pp_Var3;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return (__uniq_ptr_data<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>,_true,_true>
            )(__uniq_ptr_data<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>,_true,_true>
              )this;
  }
  __stack_chk_fail();
}

Assistant:

std::unique_ptr<PubkeyProvider> Clone() const override
    {
        return std::make_unique<ConstPubkeyProvider>(m_expr_index, m_pubkey, m_xonly);
    }